

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O3

natwm_error stack_push(stack *stack,void *data)

{
  natwm_error nVar1;
  stack_item *psVar2;
  
  psVar2 = (stack_item *)malloc(0x10);
  if (psVar2 == (stack_item *)0x0) {
    nVar1 = MEMORY_ALLOCATION_ERROR;
  }
  else {
    psVar2->next = (stack_item *)0x0;
    psVar2->data = data;
    if (stack->head != (stack_item *)0x0) {
      psVar2->next = stack->head;
    }
    stack->head = psVar2;
    stack->length = stack->length + 1;
    nVar1 = NO_ERROR;
  }
  return nVar1;
}

Assistant:

enum natwm_error stack_push(struct stack *stack, void *data)
{
        struct stack_item *item = stack_item_create(data);

        if (item == NULL) {
                return MEMORY_ALLOCATION_ERROR;
        }

        stack_push_item(stack, item);

        return NO_ERROR;
}